

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::PrintUTF8ErrorLog
          (internal *this,string_view message_name,string_view field_name,char *operation_str,
          bool emit_stacktrace)

{
  internal *piVar1;
  AlphaNum *pAVar2;
  string quoted_field_name;
  string error_message;
  string stacktrace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  AlphaNum local_160;
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  piVar1 = (internal *)message_name._M_str;
  local_110._0_8_ = local_110 + 0x10;
  local_110[8] = '\0';
  local_110[9] = '\0';
  local_110[10] = '\0';
  local_110[0xb] = '\0';
  local_110[0xc] = '\0';
  local_110[0xd] = '\0';
  local_110[0xe] = '\0';
  local_110[0xf] = '\0';
  local_110[0x10] = 0;
  pAVar2 = (AlphaNum *)field_name._M_str;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe80,"",(allocator<char> *)&local_160);
  if (piVar1 != (internal *)0x0) {
    if (this == (internal *)0x0) {
      local_160.piece_ = absl::lts_20250127::NullSafeStringView(" \'");
      local_90.piece_._M_len = (size_t)piVar1;
      local_90.piece_._M_str = (char *)field_name._M_len;
      local_c0.piece_ = absl::lts_20250127::NullSafeStringView("\'");
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_f0,(lts_20250127 *)&local_160,&local_90,&local_c0,pAVar2);
      pAVar2 = &local_f0;
    }
    else {
      local_160.piece_ = absl::lts_20250127::NullSafeStringView(" \'");
      local_90.piece_._M_len = (size_t)this;
      local_90.piece_._M_str = (char *)message_name._M_len;
      local_c0.piece_ = absl::lts_20250127::NullSafeStringView(".");
      local_f0.piece_._M_str = (char *)field_name._M_len;
      local_f0.piece_._M_len = (size_t)piVar1;
      local_60.piece_ = absl::lts_20250127::NullSafeStringView("\'");
      absl::lts_20250127::StrCat<>
                ((string *)local_130,&local_160,&local_90,&local_c0,&local_f0,&local_60);
      pAVar2 = (AlphaNum *)local_130;
    }
    std::__cxx11::string::operator=((string *)&stack0xfffffffffffffe80,(string *)pAVar2);
    std::__cxx11::string::~string((string *)pAVar2);
  }
  local_160.piece_ = absl::lts_20250127::NullSafeStringView("String field");
  local_c0.piece_ = absl::lts_20250127::NullSafeStringView(" contains invalid UTF-8 data when ");
  local_f0.piece_ =
       absl::lts_20250127::NullSafeStringView((Nullable<const_char_*>)field_name._M_str);
  local_60.piece_ =
       absl::lts_20250127::NullSafeStringView
                 (" a protocol buffer. Use the \'bytes\' type if you intend to send raw bytes. ");
  absl::lts_20250127::StrCat<std::__cxx11::string>
            ((string *)local_130,(lts_20250127 *)&local_160,&local_90,&local_c0,&local_f0,&local_60,
             (AlphaNum *)(local_130 + 0x20),in_stack_fffffffffffffe80);
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            ((LogMessage *)&local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_lite.cc"
             ,0x242);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            ((LogMessage *)&local_160,(string *)local_130);
  absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_160);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
  std::__cxx11::string::~string((string *)(local_130 + 0x20));
  return;
}

Assistant:

void PrintUTF8ErrorLog(absl::string_view message_name,
                       absl::string_view field_name, const char* operation_str,
                       bool emit_stacktrace) {
  std::string stacktrace;
  (void)emit_stacktrace;  // Parameter is used by Google-internal code.
  std::string quoted_field_name = "";
  if (!field_name.empty()) {
    if (!message_name.empty()) {
      quoted_field_name =
          absl::StrCat(" '", message_name, ".", field_name, "'");
    } else {
      quoted_field_name = absl::StrCat(" '", field_name, "'");
    }
  }
  std::string error_message =
      absl::StrCat("String field", quoted_field_name,
                   " contains invalid UTF-8 data "
                   "when ",
                   operation_str,
                   " a protocol buffer. Use the 'bytes' type if you intend to "
                   "send raw bytes. ",
                   stacktrace);
  ABSL_LOG(ERROR) << error_message;
}